

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O3

void __thiscall
TPZCompElH1<pzshape::TPZShapeTriang>::ComputeShape
          (TPZCompElH1<pzshape::TPZShapeTriang> *this,TPZVec<double> *intpoint,TPZMaterialData *data
          )

{
  TPZShapeH1<pzshape::TPZShapeTriang>::Shape(intpoint,&data->super_TPZShapeData);
  TPZFMatrix<double>::MultAdd
            (&(data->jacinv).super_TPZFMatrix<double>,
             &(data->super_TPZShapeData).fDPhi.super_TPZFMatrix<double>,
             &(data->dphix).super_TPZFMatrix<double>,&(data->dphix).super_TPZFMatrix<double>,1.0,0.0
             ,1);
  TPZFMatrix<double>::operator=
            (&(data->phi).super_TPZFMatrix<double>,
             &(data->super_TPZShapeData).fPhi.super_TPZFMatrix<double>);
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::ComputeShape(TPZVec<REAL> &intpoint, TPZMaterialData &data){
    
    TPZShapeData &shapedata = data;
    TPZShapeH1<TSHAPE>::Shape(intpoint,shapedata);
    int tranpose = 1;
    REAL alpha = 1.;
    REAL beta = 0.;
    data.jacinv.MultAdd(shapedata.fDPhi, data.dphix, data.dphix,alpha,beta,tranpose);
    data.phi = shapedata.fPhi;
}